

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O3

void duckdb_je_hpdata_purge_end(hpdata_t *hpdata,hpdata_purge_state_t *purge_state)

{
  fb_group_t *pfVar1;
  fb_group_t *pfVar2;
  uint uVar3;
  uint uVar4;
  fb_group_t fVar5;
  size_t i;
  long lVar6;
  
  i = 0;
  do {
    pfVar1 = purge_state->to_purge + i;
    uVar3 = *(uint *)((long)pfVar1 + 4);
    fVar5 = pfVar1[1];
    uVar4 = *(uint *)((long)pfVar1 + 0xc);
    pfVar2 = purge_state->to_purge + i;
    *(uint *)pfVar2 = (uint)*pfVar1 ^ 0xffffffff;
    *(uint *)((long)pfVar2 + 4) = uVar3 ^ 0xffffffff;
    *(uint *)(pfVar2 + 1) = (uint)fVar5 ^ 0xffffffff;
    *(uint *)((long)pfVar2 + 0xc) = uVar4 ^ 0xffffffff;
    i = i + 2;
  } while (i != 8);
  lVar6 = 0;
  do {
    hpdata->touched_pages[lVar6] = hpdata->touched_pages[lVar6] & purge_state->to_purge[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  hpdata->h_ntouched = hpdata->h_ntouched - purge_state->ndirty_to_purge;
  return;
}

Assistant:

void
hpdata_purge_end(hpdata_t *hpdata, hpdata_purge_state_t *purge_state) {
	assert(!hpdata_alloc_allowed_get(hpdata));
	hpdata_assert_consistent(hpdata);
	/* See the comment in reserve. */
	assert(!hpdata->h_in_psset || hpdata->h_updating);

	assert(purge_state->npurged == fb_scount(purge_state->to_purge,
	    HUGEPAGE_PAGES, 0, HUGEPAGE_PAGES));
	assert(purge_state->npurged >= purge_state->ndirty_to_purge);

	fb_bit_not(purge_state->to_purge, purge_state->to_purge,
	    HUGEPAGE_PAGES);
	fb_bit_and(hpdata->touched_pages, hpdata->touched_pages,
	    purge_state->to_purge, HUGEPAGE_PAGES);
	assert(hpdata->h_ntouched >= purge_state->ndirty_to_purge);
	hpdata->h_ntouched -= purge_state->ndirty_to_purge;

	hpdata_assert_consistent(hpdata);
}